

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::generateReference(Collimator *this)

{
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  uint in_EAX;
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 local_38;
  
  this_00 = &this->reference;
  local_38 = (ulong)in_EAX;
  pmVar2 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,(key_type_conflict *)((long)&local_38 + 4));
  pmVar2->first = -1;
  pmVar2->second = -1;
  local_38._0_4_ = 1;
  iVar4 = this->ydim;
  if (1 < iVar4) {
    iVar5 = 1;
    do {
      if (iVar5 < iVar4) {
        iVar3 = 0;
        do {
          pmVar2 = std::
                   map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                   ::operator[](this_00,(key_type_conflict *)&local_38);
          pmVar2->first = iVar3;
          pmVar2->second = iVar5 + iVar3;
          local_38._0_4_ = (int)local_38 + 1;
          iVar4 = this->ydim;
          iVar1 = iVar5 + iVar3;
          iVar3 = iVar3 + 1;
        } while (iVar1 + 1 < iVar4);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar4);
  }
  pmVar2 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,(key_type_conflict *)&local_38);
  pmVar2->first = 0;
  pmVar2->second = iVar4 + -1;
  this->ref_size = (int)local_38;
  return;
}

Assistant:

void Collimator::generateReference () {
    int i = 0;
    reference[0] = make_pair(-1,-1);
    i = 1;
    for (int s = 1; s < getYdim(); s++) {
      for (int j = 0; (j+s) < getYdim(); j++) {
        reference[i] = make_pair(j,j+s);
        i++;
      }
    }
    reference[i] = make_pair(0, getYdim()-1);
    ref_size = i;
  }